

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int eval_path_expr(lyxp_expr *exp,uint16_t *exp_idx,lyd_node *cur_node,lys_module *param_4,
                  lyxp_set *set,int options)

{
  lyxp_token tok;
  uint uVar1;
  int iVar2;
  lys_node *node;
  char *pcVar3;
  lyd_node *node_00;
  LY_ERR *pLVar4;
  char *pcVar5;
  ushort uVar6;
  long lVar7;
  lyxp_set *set_00;
  lyxp_node_type local_50;
  lyxp_node_type local_4c;
  char cStack_48;
  lyxp_node_type root_type;
  lyd_node *local_40;
  int local_34;
  
  uVar6 = *exp_idx;
  tok = exp->tokens[uVar6];
  local_40 = cur_node;
  local_34 = options;
  switch(tok) {
  case LYXP_TOKEN_PAR1:
    if ('\x02' < ly_log_level) {
      pcVar3 = "parsed";
      if (set == (lyxp_set *)0x0) {
        pcVar3 = "skipped";
      }
      pcVar5 = print_token(tok);
      ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_path_expr",pcVar3,pcVar5,
                 (ulong)exp->expr_pos[*exp_idx]);
    }
    *exp_idx = *exp_idx + 1;
    iVar2 = eval_expr(exp,exp_idx,local_40,param_4,set,local_34);
    if (iVar2 != 0) {
      return iVar2;
    }
    if ('\x02' < ly_log_level) {
      pcVar3 = "parsed";
      if (set == (lyxp_set *)0x0) {
        pcVar3 = "skipped";
      }
      pcVar5 = print_token(exp->tokens[*exp_idx]);
      ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_path_expr",pcVar3,pcVar5,
                 (ulong)exp->expr_pos[*exp_idx]);
    }
    *exp_idx = *exp_idx + 1;
    cur_node = local_40;
    goto LAB_0016be33;
  default:
    pcVar3 = print_token(tok);
    ly_vlog(LYE_XPATH_INTOK,LY_VLOG_NONE,(void *)0x0,pcVar3,exp->expr + exp->expr_pos[*exp_idx]);
    return -1;
  case LYXP_TOKEN_DOT:
  case LYXP_TOKEN_DDOT:
  case LYXP_TOKEN_AT:
  case LYXP_TOKEN_NAMETEST:
  case LYXP_TOKEN_NODETYPE:
    iVar2 = 0;
LAB_0016b8c5:
    iVar2 = eval_relative_location_path(exp,exp_idx,cur_node,param_4,iVar2,set,local_34);
    break;
  case LYXP_TOKEN_FUNCNAME:
    set_00 = set;
    if (set != (lyxp_set *)0x0 && (options & 0x1cU) == 0) goto LAB_0016be17;
    if (set != (lyxp_set *)0x0) {
      if (exp->tok_len[uVar6] == '\x05') {
LAB_0016bb34:
        iVar2 = strncmp(exp->expr + exp->expr_pos[uVar6],"deref",5);
        options = local_34;
        if (iVar2 == 0) goto LAB_0016be17;
      }
      else if (exp->tok_len[uVar6] == '\a') {
        _cStack_48 = (lys_module *)CONCAT44(root_type,7);
        iVar2 = strncmp(exp->expr + exp->expr_pos[uVar6],"current",7);
        options = local_34;
        if (iVar2 == 0) {
          xpath_current((lyxp_set **)0x0,0,local_40,param_4,set,local_34);
          goto LAB_0016be04;
        }
        if (cStack_48 == '\x05') goto LAB_0016bb34;
      }
      uVar1 = set->used;
      options = local_34;
      if ((ulong)uVar1 != 0) {
        lVar7 = 0;
        do {
          if (*(int *)((long)&((set->val).nodes)->pos + lVar7) == 1) {
            *(undefined4 *)((long)&((set->val).nodes)->pos + lVar7) = 0;
          }
          lVar7 = lVar7 + 0x10;
        } while ((ulong)uVar1 << 4 != lVar7);
      }
    }
LAB_0016be04:
    set_00 = (lyxp_set *)0x0;
LAB_0016be17:
    cur_node = local_40;
    iVar2 = eval_function_call(exp,exp_idx,local_40,param_4,set_00,options);
    goto LAB_0016be2f;
  case LYXP_TOKEN_OPERATOR_PATH:
    if (set != (lyxp_set *)0x0) {
      if ((options & 0x1cU) == 0) {
        _cStack_48 = param_4;
        node_00 = moveto_get_root(cur_node,options,&local_4c);
        lyxp_set_cast(set,LYXP_SET_EMPTY,cur_node,(lys_module *)0x0,local_34);
        param_4 = _cStack_48;
        if (node_00 != (lyd_node *)0x0) {
          set_insert_node(set,node_00,0,local_4c,0);
          param_4 = _cStack_48;
        }
      }
      else if (cur_node == (lyd_node *)0x0) {
        pLVar4 = ly_errno_location();
        *pLVar4 = LY_EINT;
        ly_log(LY_LLERR,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
               ,0x10cd);
      }
      else {
        node = moveto_snode_get_root((lys_node *)cur_node,options,&local_50);
        uVar1 = set->used;
        if ((ulong)uVar1 != 0) {
          lVar7 = 0;
          do {
            if (*(int *)((long)&((set->val).nodes)->pos + lVar7) == 1) {
              *(undefined4 *)((long)&((set->val).nodes)->pos + lVar7) = 0;
            }
            lVar7 = lVar7 + 0x10;
          } while ((ulong)uVar1 << 4 != lVar7);
        }
        set_snode_insert_node(set,node,local_50);
      }
    }
    uVar6 = *exp_idx;
    if (exp->tok_len[uVar6] == '\x01') {
      if ('\x02' < ly_log_level) {
        pcVar3 = "parsed";
        if (set == (lyxp_set *)0x0) {
          pcVar3 = "skipped";
        }
        pcVar5 = print_token(exp->tokens[uVar6]);
        cur_node = local_40;
        ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_absolute_location_path",pcVar3,pcVar5,
                   (ulong)exp->expr_pos[*exp_idx]);
      }
      uVar6 = *exp_idx + 1;
      *exp_idx = uVar6;
      iVar2 = 0;
      if (exp->used != uVar6) {
        if ((exp->tokens[uVar6] < LYXP_TOKEN_FUNCNAME) &&
           ((0x6e0U >> (exp->tokens[uVar6] & (LYXP_TOKEN_OPERATOR_PATH|LYXP_TOKEN_OPERATOR_UNI)) & 1
            ) != 0)) {
          iVar2 = 0;
          goto LAB_0016bdd0;
        }
        goto LAB_0016bde0;
      }
    }
    else {
      if ('\x02' < ly_log_level) {
        pcVar3 = "parsed";
        if (set == (lyxp_set *)0x0) {
          pcVar3 = "skipped";
        }
        _cStack_48 = param_4;
        pcVar5 = print_token(exp->tokens[uVar6]);
        param_4 = _cStack_48;
        ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_absolute_location_path",pcVar3,pcVar5,
                   (ulong)exp->expr_pos[*exp_idx]);
      }
      *exp_idx = *exp_idx + 1;
      iVar2 = 1;
LAB_0016bdd0:
      iVar2 = eval_relative_location_path(exp,exp_idx,cur_node,param_4,iVar2,set,local_34);
      if (iVar2 == 0) {
LAB_0016bde0:
        iVar2 = 0;
      }
    }
    break;
  case LYXP_TOKEN_LITERAL:
    if (set == (lyxp_set *)0x0 || (options & 0x1cU) != 0) {
      if ((set != (lyxp_set *)0x0) && (uVar1 = set->used, (ulong)uVar1 != 0)) {
        lVar7 = 0;
        do {
          if (*(int *)((long)&((set->val).nodes)->pos + lVar7) == 1) {
            *(undefined4 *)((long)&((set->val).nodes)->pos + lVar7) = 0;
          }
          lVar7 = lVar7 + 0x10;
        } while ((ulong)uVar1 << 4 != lVar7);
      }
      eval_literal(exp,exp_idx,(lyxp_set *)0x0);
    }
    else {
      eval_literal(exp,exp_idx,set);
      cur_node = local_40;
    }
LAB_0016be33:
    while( true ) {
      uVar6 = *exp_idx;
      if (exp->used <= uVar6) break;
      if (exp->tokens[uVar6] != LYXP_TOKEN_BRACK1) {
        if ((exp->used <= uVar6) || (exp->tokens[uVar6] != LYXP_TOKEN_OPERATOR_PATH)) break;
        iVar2 = 0;
        if (exp->tok_len[uVar6] != '\x01') {
          if (exp->tok_len[uVar6] != '\x02') {
            __assert_fail("exp->tok_len[*exp_idx] == 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                          ,0x19d6,
                          "int eval_path_expr(struct lyxp_expr *, uint16_t *, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                         );
          }
          iVar2 = 1;
        }
        if ('\x02' < ly_log_level) {
          pcVar3 = "parsed";
          if (set == (lyxp_set *)0x0) {
            pcVar3 = "skipped";
          }
          _cStack_48 = (lys_module *)CONCAT44(root_type,iVar2);
          pcVar5 = print_token(LYXP_TOKEN_OPERATOR_PATH);
          ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_path_expr",pcVar3,pcVar5,
                     (ulong)exp->expr_pos[*exp_idx]);
          iVar2 = _cStack_48;
        }
        *exp_idx = *exp_idx + 1;
        goto LAB_0016b8c5;
      }
      iVar2 = eval_predicate(exp,exp_idx,cur_node,param_4,set,local_34);
LAB_0016be2f:
      if (iVar2 != 0) {
        return iVar2;
      }
    }
    goto LAB_0016be1e;
  case LYXP_TOKEN_NUMBER:
    if (set == (lyxp_set *)0x0 || (options & 0x1cU) != 0) {
      if ((set != (lyxp_set *)0x0) && (uVar1 = set->used, (ulong)uVar1 != 0)) {
        lVar7 = 0;
        do {
          if (*(int *)((long)&((set->val).nodes)->pos + lVar7) == 1) {
            *(undefined4 *)((long)&((set->val).nodes)->pos + lVar7) = 0;
          }
          lVar7 = lVar7 + 0x10;
        } while ((ulong)uVar1 << 4 != lVar7);
      }
      iVar2 = eval_number(exp,exp_idx,(lyxp_set *)0x0);
      goto LAB_0016be2f;
    }
    iVar2 = eval_number(exp,exp_idx,set);
    cur_node = local_40;
    goto LAB_0016be2f;
  }
  if (iVar2 == 0) {
LAB_0016be1e:
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
eval_path_expr(struct lyxp_expr *exp, uint16_t *exp_idx, struct lyd_node *cur_node, struct lys_module *local_mod,
               struct lyxp_set *set, int options)
{
    int all_desc, ret;

    switch (exp->tokens[*exp_idx]) {
    case LYXP_TOKEN_PAR1:
        /* '(' Expr ')' */

        /* '(' */
        LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
        ++(*exp_idx);

        /* Expr */
        ret = eval_expr(exp, exp_idx, cur_node, local_mod, set, options);
        if (ret) {
            return ret;
        }

        /* ')' */
        LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
        ++(*exp_idx);

        goto predicate;

    case LYXP_TOKEN_DOT:
    case LYXP_TOKEN_DDOT:
    case LYXP_TOKEN_AT:
    case LYXP_TOKEN_NAMETEST:
    case LYXP_TOKEN_NODETYPE:
        /* RelativeLocationPath */
        ret = eval_relative_location_path(exp, exp_idx, cur_node, local_mod, 0, set, options);
        if (ret) {
            return ret;
        }
        break;

    case LYXP_TOKEN_FUNCNAME:
        /* FunctionCall */
        if (!set || (options & LYXP_SNODE_ALL)) {
            if (set) {
                /* the only function returning node-set - thus relevant */
                if ((exp->tok_len[*exp_idx] == 7) && !strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "current", 7)) {
                    xpath_current(NULL, 0, cur_node, local_mod, set, options);
                } else if ((exp->tok_len[*exp_idx] == 5) && !strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "deref", 5)) {
                    ret = eval_function_call(exp, exp_idx, cur_node, local_mod, set, options);
                    if (ret) {
                        return ret;
                    }
                    goto predicate;
                } else {
                    set_snode_clear_ctx(set);
                }
            }
            ret = eval_function_call(exp, exp_idx, cur_node, local_mod, NULL, options);
        } else {
            ret = eval_function_call(exp, exp_idx, cur_node, local_mod, set, options);
        }
        if (ret) {
            return ret;
        }

        goto predicate;

    case LYXP_TOKEN_OPERATOR_PATH:
        /* AbsoluteLocationPath */
        ret = eval_absolute_location_path(exp, exp_idx, cur_node, local_mod, set, options);
        if (ret) {
            return ret;
        }
        break;

    case LYXP_TOKEN_LITERAL:
        /* Literal */
        if (!set || (options & LYXP_SNODE_ALL)) {
            if (set) {
                set_snode_clear_ctx(set);
            }
            eval_literal(exp, exp_idx, NULL);
        } else {
            eval_literal(exp, exp_idx, set);
        }

        goto predicate;

    case LYXP_TOKEN_NUMBER:
        /* Number */
        if (!set || (options & LYXP_SNODE_ALL)) {
            if (set) {
                set_snode_clear_ctx(set);
            }
            ret = eval_number(exp, exp_idx, NULL);
        } else {
            ret = eval_number(exp, exp_idx, set);
        }
        if (ret) {
            return ret;
        }

        goto predicate;

    default:
        LOGVAL(LYE_XPATH_INTOK, LY_VLOG_NONE, NULL,
               print_token(exp->tokens[*exp_idx]), &exp->expr[exp->expr_pos[*exp_idx]]);
        return -1;
    }

    return EXIT_SUCCESS;

predicate:
    /* Predicate* */
    while ((exp->used > *exp_idx) && (exp->tokens[*exp_idx] == LYXP_TOKEN_BRACK1)) {
        ret = eval_predicate(exp, exp_idx, cur_node, local_mod, set, options);
        if (ret) {
            return ret;
        }
    }

    /* ('/' or '//') RelativeLocationPath */
    if ((exp->used > *exp_idx) && (exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_PATH)) {

        /* evaluate '/' or '//' */
        if (exp->tok_len[*exp_idx] == 1) {
            all_desc = 0;
        } else {
            assert(exp->tok_len[*exp_idx] == 2);
            all_desc = 1;
        }

        LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
        ++(*exp_idx);

        ret = eval_relative_location_path(exp, exp_idx, cur_node, local_mod, all_desc, set, options);
        if (ret) {
            return ret;
        }
    }

    return EXIT_SUCCESS;
}